

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcEdgeLogLikelihoods
          (BeagleCPU4StateImpl<float,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  float sum13;
  float sum12;
  float sum11;
  float sum10;
  float p13;
  float p12;
  float p11;
  float p10;
  float *partials1;
  int k_1;
  float m133;
  float m132;
  float m131;
  float m130;
  float m123;
  float m122;
  float m121;
  float m120;
  float m113;
  float m112;
  float m111;
  float m110;
  float m103;
  float m102;
  float m101;
  float m100;
  float weight_1;
  int v_1;
  int u_1;
  int l_1;
  int w_1;
  float *partialsChild;
  int stateChild;
  int k;
  float weight;
  int u;
  int l;
  int w;
  int v;
  int *statesChild;
  float *wt;
  float *transMatrix;
  float *partialsParent;
  double *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  uint in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  uint in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  
  lVar17 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 8);
  lVar18 = *(long *)(*(long *)(in_RDI + 0xd0) + (long)in_ECX * 8);
  lVar19 = *(long *)(*(long *)(in_RDI + 0x98) + (long)in_R8D * 8);
  memset(*(void **)(in_RDI + 0xd8),0,(long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 2)
  ;
  if ((in_EDX < *(int *)(in_RDI + 0x10)) &&
     (*(long *)(*(long *)(in_RDI + 0xb0) + (long)in_EDX * 8) != 0)) {
    lVar20 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)in_EDX * 8);
    local_44 = 0;
    local_48 = 0;
    for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x34); local_4c = local_4c + 1) {
      local_50 = 0;
      uVar1 = *(uint *)(lVar19 + (long)local_4c * 4);
      for (local_58 = 0; local_58 < *(int *)(in_RDI + 0x14); local_58 = local_58 + 1) {
        iVar26 = *(int *)(lVar20 + (long)local_58 * 4);
        auVar22 = vfmadd213ss_fma(ZEXT416(uVar1),
                                  ZEXT416((uint)(*(float *)(lVar18 + (long)(local_48 + iVar26) * 4)
                                                * *(float *)(lVar17 + (long)local_44 * 4))),
                                  ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_50 * 4)))
        ;
        *(int *)(*(long *)(in_RDI + 0xd8) + (long)local_50 * 4) = auVar22._0_4_;
        auVar22 = vfmadd213ss_fma(ZEXT416(uVar1),
                                  ZEXT416((uint)(*(float *)(lVar18 + (long)(local_48 + 5 + iVar26) *
                                                                     4) *
                                                *(float *)(lVar17 + (long)(local_44 + 1) * 4))),
                                  ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) +
                                                   (long)(local_50 + 1) * 4)));
        *(int *)(*(long *)(in_RDI + 0xd8) + (long)(local_50 + 1) * 4) = auVar22._0_4_;
        auVar22 = vfmadd213ss_fma(ZEXT416(uVar1),
                                  ZEXT416((uint)(*(float *)(lVar18 + (long)(local_48 + 10 + iVar26)
                                                                     * 4) *
                                                *(float *)(lVar17 + (long)(local_44 + 2) * 4))),
                                  ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) +
                                                   (long)(local_50 + 2) * 4)));
        *(int *)(*(long *)(in_RDI + 0xd8) + (long)(local_50 + 2) * 4) = auVar22._0_4_;
        auVar22 = vfmadd213ss_fma(ZEXT416(uVar1),
                                  ZEXT416((uint)(*(float *)(lVar18 + (long)(local_48 + 0xf + iVar26)
                                                                     * 4) *
                                                *(float *)(lVar17 + (long)(local_44 + 3) * 4))),
                                  ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) +
                                                   (long)(local_50 + 3) * 4)));
        *(int *)(*(long *)(in_RDI + 0xd8) + (long)(local_50 + 3) * 4) = auVar22._0_4_;
        local_50 = local_50 + 4;
        local_44 = local_44 + 4;
      }
      local_48 = local_48 + 0x14;
      if (*(int *)(in_RDI + 0x1c) != 0) {
        local_44 = *(int *)(in_RDI + 0x1c) * 4 + local_44;
      }
    }
  }
  else {
    pdVar21 = *(double **)(*(long *)(in_RDI + 0xa8) + (long)in_EDX * 8);
    local_6c = 0;
    for (local_70 = 0; local_70 < *(int *)(in_RDI + 0x34); local_70 = local_70 + 1) {
      local_74 = 0;
      local_78 = local_70 * *(int *)(in_RDI + 0x18) * 4;
      uVar1 = *(uint *)(lVar19 + (long)local_70 * 4);
      uVar2 = *(uint *)(lVar18 + (long)local_6c * 4);
      fVar3 = *(float *)(lVar18 + (long)(local_6c + 1) * 4);
      uVar4 = *(uint *)(lVar18 + (long)(local_6c + 2) * 4);
      uVar5 = *(uint *)(lVar18 + (long)(local_6c + 3) * 4);
      uVar6 = *(uint *)(lVar18 + (long)(local_6c + 5) * 4);
      fVar7 = *(float *)(lVar18 + (long)(local_6c + 6) * 4);
      uVar8 = *(uint *)(lVar18 + (long)(local_6c + 7) * 4);
      uVar9 = *(uint *)(lVar18 + (long)(local_6c + 8) * 4);
      uVar10 = *(uint *)(lVar18 + (long)(local_6c + 10) * 4);
      fVar11 = *(float *)(lVar18 + (long)(local_6c + 0xb) * 4);
      uVar12 = *(uint *)(lVar18 + (long)(local_6c + 0xc) * 4);
      in_stack_ffffffffffffff54 = *(uint *)(lVar18 + (long)(local_6c + 0xd) * 4);
      in_stack_ffffffffffffff50 = *(uint *)(lVar18 + (long)(local_6c + 0xf) * 4);
      in_stack_ffffffffffffff4c = *(float *)(lVar18 + (long)(local_6c + 0x10) * 4);
      in_stack_ffffffffffffff48 = *(uint *)(lVar18 + (long)(local_6c + 0x11) * 4);
      in_stack_ffffffffffffff44 = *(uint *)(lVar18 + (long)(local_6c + 0x12) * 4);
      for (in_stack_ffffffffffffff40 = 0; in_stack_ffffffffffffff40 < *(int *)(in_RDI + 0x14);
          in_stack_ffffffffffffff40 = in_stack_ffffffffffffff40 + 1) {
        uVar13 = *(uint *)((long)pdVar21 + (long)local_78 * 4);
        fVar14 = *(float *)((long)pdVar21 + (long)(local_78 + 1) * 4);
        uVar15 = *(uint *)((long)pdVar21 + (long)(local_78 + 2) * 4);
        uVar16 = *(uint *)((long)pdVar21 + (long)(local_78 + 3) * 4);
        auVar22 = vfmadd213ss_fma(ZEXT416(uVar13),ZEXT416(uVar2),ZEXT416((uint)(fVar3 * fVar14)));
        auVar22 = vfmadd213ss_fma(ZEXT416(uVar15),ZEXT416(uVar4),auVar22);
        auVar22 = vfmadd213ss_fma(ZEXT416(uVar16),ZEXT416(uVar5),auVar22);
        auVar23 = vfmadd213ss_fma(ZEXT416(uVar13),ZEXT416(uVar6),ZEXT416((uint)(fVar7 * fVar14)));
        auVar23 = vfmadd213ss_fma(ZEXT416(uVar15),ZEXT416(uVar8),auVar23);
        auVar23 = vfmadd213ss_fma(ZEXT416(uVar16),ZEXT416(uVar9),auVar23);
        auVar24 = vfmadd213ss_fma(ZEXT416(uVar13),ZEXT416(uVar10),ZEXT416((uint)(fVar11 * fVar14)));
        auVar24 = vfmadd213ss_fma(ZEXT416(uVar15),ZEXT416(uVar12),auVar24);
        auVar24 = vfmadd213ss_fma(ZEXT416(uVar16),ZEXT416(in_stack_ffffffffffffff54),auVar24);
        auVar25 = vfmadd213ss_fma(ZEXT416(uVar13),ZEXT416(in_stack_ffffffffffffff50),
                                  ZEXT416((uint)(in_stack_ffffffffffffff4c * fVar14)));
        auVar25 = vfmadd213ss_fma(ZEXT416(uVar15),ZEXT416(in_stack_ffffffffffffff48),auVar25);
        auVar25 = vfmadd213ss_fma(ZEXT416(uVar16),ZEXT416(in_stack_ffffffffffffff44),auVar25);
        auVar22 = vfmadd213ss_fma(ZEXT416(uVar1),
                                  ZEXT416((uint)(auVar22._0_4_ *
                                                *(float *)(lVar17 + (long)local_78 * 4))),
                                  ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_74 * 4)))
        ;
        *(int *)(*(long *)(in_RDI + 0xd8) + (long)local_74 * 4) = auVar22._0_4_;
        auVar22 = vfmadd213ss_fma(ZEXT416(uVar1),
                                  ZEXT416((uint)(auVar23._0_4_ *
                                                *(float *)(lVar17 + (long)(local_78 + 1) * 4))),
                                  ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) +
                                                   (long)(local_74 + 1) * 4)));
        *(int *)(*(long *)(in_RDI + 0xd8) + (long)(local_74 + 1) * 4) = auVar22._0_4_;
        auVar22 = vfmadd213ss_fma(ZEXT416(uVar1),
                                  ZEXT416((uint)(auVar24._0_4_ *
                                                *(float *)(lVar17 + (long)(local_78 + 2) * 4))),
                                  ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) +
                                                   (long)(local_74 + 2) * 4)));
        *(int *)(*(long *)(in_RDI + 0xd8) + (long)(local_74 + 2) * 4) = auVar22._0_4_;
        auVar22 = vfmadd213ss_fma(ZEXT416(uVar1),
                                  ZEXT416((uint)(auVar25._0_4_ *
                                                *(float *)(lVar17 + (long)(local_78 + 3) * 4))),
                                  ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) +
                                                   (long)(local_74 + 3) * 4)));
        *(int *)(*(long *)(in_RDI + 0xd8) + (long)(local_74 + 3) * 4) = auVar22._0_4_;
        local_74 = local_74 + 4;
        local_78 = local_78 + 4;
        in_stack_ffffffffffffff38 = pdVar21;
      }
      local_6c = local_6c + 0x14;
    }
  }
  iVar26 = integrateOutStatesAndScale
                     ((BeagleCPU4StateImpl<float,_1,_0> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (float *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
  ;
  return iVar26;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoods(const int parIndex,
                                                           const int childIndex,
                                                           const int probIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                           const int scalingFactorsIndex,
                                                           double* outSumLogLikelihood) {
    // TODO: implement derivatives for calculateEdgeLnL

    assert(parIndex >= kTipCount);

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];

                integrationTmp[u    ] += transMatrix[w            + stateChild] * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += transMatrix[w + OFFSET*1 + stateChild] * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += transMatrix[w + OFFSET*2 + stateChild] * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += transMatrix[w + OFFSET*3 + stateChild] * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
		#if 0//
        int v = 0;
		#endif
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
			#if 1//
			int v = l*kPaddedPatternCount*4;
			#endif
            const REALTYPE weight = wt[l];

            PREFETCH_MATRIX(1,transMatrix,w);

            for(int k = 0; k < kPatternCount; k++) {

                const REALTYPE* partials1 = partialsChild;

                PREFETCH_PARTIALS(1,partials1,v);

                DO_INTEGRATION(1);

                integrationTmp[u    ] += sum10 * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += sum11 * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += sum12 * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += sum13 * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
			#if 0//
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
			#endif//
        }
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}